

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# faidx.c
# Opt level: O1

void fai_insert_index(faidx_t *idx,char *name,int len,int line_len,int line_blen,uint64_t offset)

{
  khint_t kVar1;
  uint uVar2;
  kh_s_t *h;
  khint32_t *pkVar3;
  faidx1_t *pfVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  khint_t kVar9;
  char **ppcVar10;
  char *pcVar11;
  byte bVar12;
  char *pcVar13;
  uint uVar14;
  khint_t kVar15;
  khint_t kVar16;
  uint uVar17;
  
  iVar6 = idx->m;
  if (idx->n == iVar6) {
    iVar8 = 0x10;
    if (iVar6 != 0) {
      iVar8 = iVar6 * 2;
    }
    idx->m = iVar8;
    ppcVar10 = (char **)realloc(idx->name,(long)iVar8 << 3);
    idx->name = ppcVar10;
  }
  pcVar11 = strdup(name);
  iVar6 = idx->n;
  idx->name[iVar6] = pcVar11;
  h = idx->hash;
  pcVar11 = idx->name[iVar6];
  if (h->upper_bound <= h->n_occupied) {
    uVar17 = h->n_buckets;
    if (h->size * 2 < uVar17) {
      kVar15 = uVar17 - 1;
    }
    else {
      kVar15 = uVar17 + 1;
    }
    iVar6 = kh_resize_s(h,kVar15);
    if (iVar6 < 0) {
      kVar15 = h->n_buckets;
      goto LAB_00140263;
    }
  }
  kVar1 = h->n_buckets;
  uVar17 = (uint)*pcVar11;
  if (*pcVar11 == '\0') {
    uVar17 = 0;
  }
  else {
    cVar5 = pcVar11[1];
    if (cVar5 != '\0') {
      pcVar13 = pcVar11 + 2;
      do {
        uVar17 = (int)cVar5 + uVar17 * 0x1f;
        cVar5 = *pcVar13;
        pcVar13 = pcVar13 + 1;
      } while (cVar5 != '\0');
    }
  }
  kVar15 = uVar17 & kVar1 - 1;
  pkVar3 = h->flags;
  if ((pkVar3[kVar15 >> 4] >> ((char)kVar15 * '\x02' & 0x1fU) & 2) == 0) {
    iVar6 = 1;
    uVar17 = kVar15;
    kVar16 = kVar1;
    do {
      uVar2 = pkVar3[uVar17 >> 4];
      uVar14 = uVar17 * 2 & 0x1e;
      uVar7 = uVar2 >> (sbyte)uVar14;
      kVar9 = kVar1;
      if (((uVar7 & 2) != 0) ||
         (((uVar7 & 1) == 0 && (iVar8 = strcmp(h->keys[uVar17],pcVar11), iVar8 == 0)))) break;
      if ((uVar2 >> uVar14 & 1) != 0) {
        kVar16 = uVar17;
      }
      uVar17 = uVar17 + iVar6 & kVar1 - 1;
      iVar6 = iVar6 + 1;
      kVar9 = kVar16;
    } while (uVar17 != kVar15);
    kVar15 = kVar9;
    if (kVar9 == kVar1) {
      if (kVar16 == kVar1) {
        kVar16 = uVar17;
      }
      kVar15 = kVar16;
      if ((pkVar3[uVar17 >> 4] >> ((char)uVar17 * '\x02' & 0x1fU) & 2) == 0) {
        kVar15 = uVar17;
      }
    }
  }
  uVar17 = kVar15 >> 4;
  bVar12 = (char)kVar15 * '\x02' & 0x1e;
  if ((pkVar3[uVar17] >> bVar12 & 2) == 0) {
    if ((pkVar3[uVar17] >> bVar12 & 1) != 0) {
      h->keys[kVar15] = pcVar11;
      h->flags[uVar17] = h->flags[uVar17] & ~(3 << bVar12);
      h->size = h->size + 1;
    }
  }
  else {
    h->keys[kVar15] = pcVar11;
    h->flags[uVar17] = h->flags[uVar17] & ~(3 << bVar12);
    h->size = h->size + 1;
    h->n_occupied = h->n_occupied + 1;
  }
LAB_00140263:
  pfVar4 = idx->hash->vals;
  pfVar4[kVar15].line_len = line_len;
  pfVar4[kVar15].line_blen = line_blen;
  pfVar4[kVar15].len = (long)len;
  pfVar4[kVar15].offset = offset;
  idx->n = idx->n + 1;
  return;
}

Assistant:

static inline void fai_insert_index(faidx_t *idx, const char *name, int len, int line_len, int line_blen, uint64_t offset)
{
    khint_t k;
    int ret;
    faidx1_t t;
    if (idx->n == idx->m) {
        idx->m = idx->m? idx->m<<1 : 16;
        idx->name = (char**)realloc(idx->name, sizeof(char*) * idx->m);
    }
    idx->name[idx->n] = strdup(name);
    k = kh_put(s, idx->hash, idx->name[idx->n], &ret);
    t.len = len; t.line_len = line_len; t.line_blen = line_blen; t.offset = offset;
    kh_value(idx->hash, k) = t;
    ++idx->n;
}